

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O0

void __thiscall Map::Country::Country(Country *this,Country *toCopy)

{
  bool bVar1;
  ostream *poVar2;
  int *piVar3;
  string *this_00;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar4;
  size_type __n;
  Country *this_01;
  Country *local_50;
  reference local_48;
  Country **pAdjCountry;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  Country *toCopy_local;
  Country *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"In country copy constructor:");
  std::operator<<(poVar2,(string *)toCopy->cyName);
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->cyID;
  this->cyID = piVar3;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)toCopy->cyName);
  this->cyName = this_00;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->cyContinent;
  this->cyContinent = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->pPlayerOwnerId;
  this->pPlayerOwnerId = piVar3;
  piVar3 = (int *)operator_new(4);
  *piVar3 = *toCopy->pNumberOfTroops;
  this->pNumberOfTroops = piVar3;
  pvVar4 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)operator_new(0x18);
  memset(pvVar4,0,0x18);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::vector(pvVar4);
  this->pAdjCountries = pvVar4;
  pvVar4 = this->pAdjCountries;
  __n = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::size(toCopy->pAdjCountries);
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::reserve(pvVar4,__n);
  pvVar4 = toCopy->pAdjCountries;
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar4);
  pAdjCountry = (Country **)
                std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                *)&pAdjCountry);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
               ::operator*(&__end1);
    pvVar4 = this->pAdjCountries;
    this_01 = (Country *)operator_new(0x30);
    Country(this_01,*local_48);
    local_50 = this_01;
    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back(pvVar4,&local_50);
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

Map::Country::Country(const Country& toCopy) {
    std::cout << "In country copy constructor:" << *toCopy.cyName;
    this->cyID = new int(*toCopy.cyID);
    this->cyName = new std::string(*toCopy.cyName);
    this->cyContinent = new int(*toCopy.cyContinent);
    this->pPlayerOwnerId = new int(*toCopy.pPlayerOwnerId);
    this->pNumberOfTroops = new int(*toCopy.pNumberOfTroops);
    this->pAdjCountries = new std::vector<Country*>();
    this->pAdjCountries->reserve(toCopy.pAdjCountries->size());
    for(auto & pAdjCountry : *toCopy.pAdjCountries) {
        this->pAdjCountries->push_back(new Country(*pAdjCountry));
    }
}